

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

int glu::TextureTestUtil::computeTextureCompareDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,TextureCubeView *src,float *texCoord,
              ReferenceParams *sampleParams,TexComparePrecision *comparePrec,LodPrecision *lodPrec,
              Vec3 *nonShadowThreshold)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int faceSize;
  ReferenceParams *pRVar5;
  ulong uVar6;
  bool bVar7;
  int i;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int y;
  ConstPixelBufferAccess *pCVar11;
  int lodOffsNdx;
  int z;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Vector<float,_3> res;
  Vector<bool,_3> res_2;
  Vector<float,_3> res_1;
  Vec2 lodBounds;
  Vec3 coordDyo;
  Vec3 coordDy;
  Vec3 coordDx;
  Vec3 triW [2];
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  Vec2 lodO;
  Vec4 resPix;
  Vec4 refPix;
  Vec2 lodBias;
  Vec2 lodOffsets [4];
  Vec3 local_258;
  Vec3 local_24c;
  ConstPixelBufferAccess *local_240;
  Vec4 local_238;
  int local_224;
  int local_220;
  float local_21c;
  float local_218;
  float local_214;
  float local_210;
  float local_20c;
  float local_208;
  float local_204;
  float local_200 [2];
  ReferenceParams *local_1f8;
  Vec3 local_1f0;
  Vec3 local_1e4;
  Vec3 local_1d8;
  float local_1cc;
  float local_1c8;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  float local_1b0;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float local_188;
  float local_184;
  float local_180;
  float local_17c;
  float local_178 [8];
  float local_158 [8];
  float local_138 [8];
  float local_118 [8];
  PixelBufferAccess *local_f8;
  float local_f0;
  float local_ec;
  undefined1 local_e8 [20];
  float local_d4 [2];
  float local_cc;
  undefined1 local_c8 [16];
  Sampler *local_b0;
  TextureCubeView *local_a8;
  ulong local_a0;
  ConstPixelBufferAccess *local_98;
  float afStack_90 [6];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58 [10];
  
  local_118[0] = *texCoord;
  local_138[0] = texCoord[1];
  local_118[1] = texCoord[3];
  local_118[2] = texCoord[6];
  local_118[3] = texCoord[9];
  local_138[1] = texCoord[4];
  local_138[2] = texCoord[7];
  local_138[3] = texCoord[10];
  local_158[0] = texCoord[2];
  local_158[1] = texCoord[5];
  local_158[2] = texCoord[8];
  local_158[3] = texCoord[0xb];
  if (src->m_numLevels < 1) {
    local_224 = 0;
  }
  else {
    local_224 = (src->m_levels[0]->m_size).m_data[0];
  }
  fVar18 = (float)(result->m_size).m_data[0];
  fVar19 = (float)(result->m_size).m_data[1];
  local_178[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_178[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_178[2] = (sampleParams->super_RenderParams).w.m_data[2];
  local_178[3] = (sampleParams->super_RenderParams).w.m_data[3];
  fVar12 = 0.0;
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    fVar12 = (sampleParams->super_RenderParams).bias;
  }
  lVar8 = 0;
  do {
    afStack_90[lVar8] = fVar12;
    lVar8 = lVar8 + 1;
  } while (lVar8 == 1);
  local_58[0] = -1.0;
  local_58[1] = 0.0;
  local_58[2] = 1.0;
  local_58[3] = 0.0;
  local_58[4] = 0.0;
  local_58[5] = -1.0;
  local_58[6] = 0.0;
  local_58[7] = 1.0;
  local_e8._16_4_ = -1.7146522e+38;
  local_240 = result;
  local_1f8 = sampleParams;
  local_178[4] = local_178[2];
  local_178[5] = local_178[1];
  local_158[4] = local_158[2];
  local_158[5] = local_158[1];
  local_138[4] = local_138[2];
  local_138[5] = local_138[1];
  local_118[4] = local_118[2];
  local_118[5] = local_118[1];
  local_98 = reference;
  tcu::RGBA::toVec((RGBA *)local_e8);
  tcu::clear(errorMask,(Vec4 *)local_e8);
  if ((local_240->m_size).m_data[1] < 1) {
    uVar10 = 0;
  }
  else {
    local_b0 = &local_1f8->sampler;
    uVar10 = 0;
    z = 0;
    pCVar11 = local_240;
    local_f8 = errorMask;
    local_a8 = src;
    do {
      if (0 < (pCVar11->m_size).m_data[0]) {
        local_218 = (float)z + 0.5;
        local_21c = local_218 / fVar19;
        local_1c8 = fVar19 - local_218;
        local_1cc = 1.0 - local_21c;
        y = 0;
        local_220 = z;
        do {
          tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_e8,(int)pCVar11,y,z)
          ;
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)(local_e8 + 0x10),(int)local_98,y,z);
          faceSize = local_224;
          local_1d8.m_data[0] = local_d4[0];
          local_1d8.m_data[1] = local_d4[1];
          local_1d8.m_data[2] = local_cc;
          local_1e4.m_data[0] = (float)local_e8._4_4_;
          local_1e4.m_data[1] = (float)local_e8._8_4_;
          local_1e4.m_data[2] = (float)local_e8._12_4_;
          local_258.m_data[0] = 0.0;
          local_258.m_data[1] = 0.0;
          local_258.m_data[2] = 0.0;
          lVar8 = 0;
          do {
            local_258.m_data[lVar8] = local_1d8.m_data[lVar8] - local_1e4.m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          local_238.m_data[2] = 0.0;
          local_238.m_data[0] = 0.0;
          local_238.m_data[1] = 0.0;
          lVar8 = 0;
          do {
            fVar12 = local_258.m_data[lVar8];
            fVar15 = -fVar12;
            if (-fVar12 <= fVar12) {
              fVar15 = fVar12;
            }
            local_238.m_data[lVar8] = fVar15;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          local_24c.m_data[0] = (float)((uint)local_24c.m_data[0] & 0xff000000);
          lVar8 = 0;
          do {
            *(bool *)((long)local_24c.m_data + lVar8) =
                 local_238.m_data[lVar8] <= nonShadowThreshold->m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          if (local_24c.m_data[0]._0_1_ == (tcu)0x0) {
LAB_00856f49:
            local_258.m_data[0] = -1.7014636e+38;
            tcu::RGBA::toVec((RGBA *)&local_238);
            tcu::PixelBufferAccess::setPixel(errorMask,&local_238,y,z,0);
            uVar10 = (ulong)((int)uVar10 + 1);
          }
          else {
            uVar6 = 0;
            do {
              uVar9 = uVar6;
              if (uVar9 == 2) break;
              uVar6 = uVar9 + 1;
            } while (*(char *)((long)local_24c.m_data + uVar9 + 1) != '\0');
            if (uVar9 < 2) goto LAB_00856f49;
            if (((float)local_e8._0_4_ != (float)local_e8._16_4_) ||
               (NAN((float)local_e8._0_4_) || NAN((float)local_e8._16_4_))) {
              fVar17 = (float)y + 0.5;
              fVar15 = fVar17 / fVar18;
              bVar7 = 1.0 <= local_21c + fVar15;
              fVar12 = local_21c;
              local_180 = local_218;
              local_17c = fVar17;
              if (bVar7) {
                fVar15 = 1.0 - fVar15;
                fVar12 = local_1cc;
                local_180 = local_1c8;
                local_17c = fVar18 - fVar17;
              }
              uVar6 = (ulong)bVar7;
              fVar1 = local_118[uVar6 * 3];
              local_204 = local_118[uVar6 * 3 + 1];
              fVar13 = (1.0 - fVar15) - fVar12;
              afStack_90[2] = local_178[uVar6 * 3];
              local_184 = local_178[uVar6 * 3 + 1];
              local_208 = local_118[uVar6 * 3 + 2];
              local_188 = local_178[uVar6 * 3 + 2];
              fVar16 = fVar15 / local_188 + fVar12 / local_184 + fVar13 / afStack_90[2];
              fVar2 = local_138[uVar6 * 3];
              local_20c = local_138[uVar6 * 3 + 1];
              local_210 = local_138[uVar6 * 3 + 2];
              fVar3 = local_158[uVar6 * 3];
              fVar4 = local_158[uVar6 * 3 + 1];
              local_214 = local_158[uVar6 * 3 + 2];
              local_258.m_data[2] =
                   ((fVar15 * local_214) / local_188 +
                   (fVar12 * fVar4) / local_184 + (fVar13 * fVar3) / afStack_90[2]) / fVar16;
              local_258.m_data[1] =
                   ((fVar15 * local_210) / local_188 +
                   (fVar12 * local_20c) / local_184 + (fVar13 * fVar2) / afStack_90[2]) / fVar16;
              local_258.m_data[0] =
                   ((fVar15 * local_208) / local_188 +
                   (fVar12 * local_204) / local_184 + (fVar13 * fVar1) / afStack_90[2]) / fVar16;
              fVar16 = fVar12 + -1.0;
              local_18c = local_188 * fVar18;
              local_190 = local_184 * local_188;
              fVar14 = (fVar18 * fVar16 + fVar17) * local_190 -
                       (local_18c * fVar12 + fVar17 * local_184) * afStack_90[2];
              local_194 = (local_204 - fVar1) * local_188 + (local_208 - local_204) * afStack_90[2];
              local_198 = (fVar1 - local_208) * local_184;
              local_19c = (local_20c - fVar2) * local_188 + (local_210 - local_20c) * afStack_90[2];
              local_1a0 = (fVar2 - local_210) * local_184;
              local_1a4 = (fVar4 - fVar3) * local_188 + (local_214 - fVar4) * afStack_90[2];
              local_1a8 = (fVar3 - local_214) * local_184;
              fVar17 = afStack_90[2] * local_184 * local_188;
              fVar13 = fVar17 * fVar18;
              fVar14 = fVar14 * fVar14;
              local_78 = ZEXT416((uint)fVar13);
              local_1d8.m_data[2] = ((fVar16 * local_1a8 + fVar12 * local_1a4) * fVar13) / fVar14;
              local_1d8.m_data[1] = ((local_1a0 * fVar16 + fVar12 * local_19c) * fVar13) / fVar14;
              local_1d8.m_data[0] = ((local_198 * fVar16 + fVar12 * local_194) * fVar13) / fVar14;
              local_1ac = local_184 * fVar19;
              fVar12 = fVar15 + -1.0;
              fVar13 = (fVar19 * fVar12 + local_218) * local_190 -
                       (local_1ac * fVar15 + local_218 * local_188) * afStack_90[2];
              local_1b0 = (local_204 - local_208) * afStack_90[2] + (local_208 - fVar1) * local_184;
              local_1b4 = (fVar1 - local_204) * local_188;
              local_1b8 = (local_20c - local_210) * afStack_90[2] + (local_210 - fVar2) * local_184;
              local_1bc = (fVar2 - local_20c) * local_188;
              local_1c0 = (fVar4 - local_214) * afStack_90[2] + (local_214 - fVar3) * local_184;
              local_1c4 = (fVar3 - fVar4) * local_188;
              fVar17 = fVar17 * fVar19;
              local_68 = ZEXT416((uint)fVar17);
              fVar13 = fVar13 * fVar13;
              local_1e4.m_data[2] = ((fVar12 * local_1c4 + fVar15 * local_1c0) * fVar17) / fVar13;
              local_1e4.m_data[1] = ((local_1bc * fVar12 + fVar15 * local_1b8) * fVar17) / fVar13;
              local_1e4.m_data[0] = ((local_1b4 * fVar12 + fVar15 * local_1b0) * fVar17) / fVar13;
              local_c8 = ZEXT416((uint)afStack_90[2]);
              afStack_90[2] = -afStack_90[2];
              afStack_90[3] = -0.0;
              afStack_90[4] = -0.0;
              afStack_90[5] = -0.0;
              local_a0 = uVar10;
              tcu::computeCubeLodBoundsFromDerivates
                        ((tcu *)local_200,&local_258,&local_1d8,&local_1e4,local_224,lodPrec);
              lVar8 = 0;
              do {
                fVar13 = local_58[lVar8 * 2] + local_17c;
                fVar15 = local_58[lVar8 * 2 + 1] + local_180;
                fVar12 = fVar13 / fVar18;
                fVar17 = fVar15 / fVar19;
                fVar16 = (1.0 - fVar12) - fVar17;
                fVar14 = fVar12 / local_188 + fVar17 / local_184 + fVar16 / (float)local_c8._0_4_;
                local_238.m_data[2] =
                     ((local_214 * fVar12) / local_188 +
                     (fVar4 * fVar17) / local_184 + (fVar16 * fVar3) / (float)local_c8._0_4_) /
                     fVar14;
                local_238.m_data[1] =
                     ((local_210 * fVar12) / local_188 +
                     (local_20c * fVar17) / local_184 + (fVar2 * fVar16) / (float)local_c8._0_4_) /
                     fVar14;
                local_238.m_data[0] =
                     ((local_208 * fVar12) / local_188 +
                     (local_204 * fVar17) / local_184 + (fVar1 * fVar16) / (float)local_c8._0_4_) /
                     fVar14;
                fVar16 = fVar17 + -1.0;
                local_24c.m_data[2] =
                     (fVar18 * fVar16 + fVar13) * local_190 +
                     (local_18c * fVar17 + fVar13 * local_184) * afStack_90[2];
                local_24c.m_data[2] = local_24c.m_data[2] * local_24c.m_data[2];
                local_24c.m_data[0] =
                     ((local_198 * fVar16 + local_194 * fVar17) * (float)local_78._0_4_) /
                     local_24c.m_data[2];
                local_24c.m_data[1] =
                     ((local_1a0 * fVar16 + local_19c * fVar17) * (float)local_78._0_4_) /
                     local_24c.m_data[2];
                local_24c.m_data[2] =
                     ((fVar16 * local_1a8 + fVar17 * local_1a4) * (float)local_78._0_4_) /
                     local_24c.m_data[2];
                fVar17 = fVar12 + -1.0;
                fVar15 = (fVar19 * fVar17 + fVar15) * local_190 +
                         (local_1ac * fVar12 + fVar15 * local_188) * afStack_90[2];
                fVar15 = fVar15 * fVar15;
                local_1f0.m_data[2] =
                     ((fVar17 * local_1c4 + fVar12 * local_1c0) * (float)local_68._0_4_) / fVar15;
                local_1f0.m_data[1] =
                     ((local_1bc * fVar17 + local_1b8 * fVar12) * (float)local_68._0_4_) / fVar15;
                local_1f0.m_data[0] =
                     ((local_1b4 * fVar17 + local_1b0 * fVar12) * (float)local_68._0_4_) / fVar15;
                tcu::computeCubeLodBoundsFromDerivates
                          ((tcu *)&local_f0,(Vec3 *)&local_238,&local_24c,&local_1f0,faceSize,
                           lodPrec);
                pRVar5 = local_1f8;
                local_200[0] = (float)(~-(uint)(local_200[0] <= local_f0) & (uint)local_f0 |
                                      (uint)local_200[0] & -(uint)(local_200[0] <= local_f0));
                local_200[1] = (float)(~-(uint)(local_ec <= local_200[1]) & (uint)local_ec |
                                      (uint)local_200[1] & -(uint)(local_ec <= local_200[1]));
                lVar8 = lVar8 + 1;
              } while (lVar8 != 4);
              local_238.m_data[0] = 0.0;
              local_238.m_data[1] = 0.0;
              lVar8 = 0;
              do {
                local_238.m_data[lVar8] = local_200[lVar8] + afStack_90[lVar8];
                lVar8 = lVar8 + 1;
              } while (lVar8 == 1);
              local_1f0.m_data[0] = local_1f8->minLod;
              local_1f0.m_data[1] = local_1f8->maxLod;
              tcu::clampLodBounds((tcu *)&local_24c,(Vec2 *)&local_238,(Vec2 *)&local_1f0,lodPrec);
              bVar7 = tcu::isTexCompareResultValid
                                (local_a8,local_b0,comparePrec,&local_258,(Vec2 *)&local_24c,
                                 (pRVar5->super_RenderParams).ref,(float)local_e8._0_4_);
              uVar10 = local_a0;
              errorMask = local_f8;
              z = local_220;
              if (!bVar7) {
                local_1f0.m_data[0] = -1.7014636e+38;
                tcu::RGBA::toVec((RGBA *)&local_238);
                errorMask = local_f8;
                z = local_220;
                tcu::PixelBufferAccess::setPixel(local_f8,&local_238,y,local_220,0);
                uVar10 = (ulong)((int)uVar10 + 1);
              }
            }
          }
          y = y + 1;
          pCVar11 = local_240;
        } while (y < (local_240->m_size).m_data[0]);
      }
      z = z + 1;
    } while (z < (pCVar11->m_size).m_data[1]);
  }
  return (int)uVar10;
}

Assistant:

int computeTextureCompareDiff (const tcu::ConstPixelBufferAccess&	result,
							   const tcu::ConstPixelBufferAccess&	reference,
							   const tcu::PixelBufferAccess&		errorMask,
							   const tcu::TextureCubeView&			src,
							   const float*							texCoord,
							   const ReferenceParams&				sampleParams,
							   const tcu::TexComparePrecision&		comparePrec,
							   const tcu::LodPrecision&				lodPrec,
							   const tcu::Vec3&						nonShadowThreshold)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	const tcu::Vec4		sq				= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4		tq				= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4		rq				= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2	dstSize			= tcu::IVec2(result.getWidth(), result.getHeight());
	const float			dstW			= float(dstSize.x());
	const float			dstH			= float(dstSize.y());
	const int			srcSize			= src.getSize();

	// Coordinates per triangle.
	const tcu::Vec3		triS[2]			= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3		triT[2]			= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3		triR[2]			= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3		triW[2]			= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2		lodBias			((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int					numFailed		= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= result.getPixel(px, py);
			const tcu::Vec4	refPix	= reference.getPixel(px, py);

			// Other channels should trivially match to reference.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(refPix.swizzle(1,2,3) - resPix.swizzle(1,2,3)), nonShadowThreshold)))
			{
				errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
				numFailed += 1;
				continue;
			}

			// Reference result is known to be a valid result, we can
			// skip verification if thes results are equal
			if (resPix.x() != refPix.x())
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
				const tcu::Vec3	coordDx		(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
											 triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy),
											 triDerivateX(triR[triNdx], triW[triNdx], wx, dstW, triNy));
				const tcu::Vec3	coordDy		(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
											 triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx),
											 triDerivateY(triR[triNdx], triW[triNdx], wy, dstH, triNx));

				tcu::Vec2		lodBounds	= tcu::computeCubeLodBoundsFromDerivates(coord, coordDx, coordDy, srcSize, lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const tcu::Vec3	coordO		(projectedTriInterpolate(triS[triNdx], triW[triNdx], nxo, nyo),
												 projectedTriInterpolate(triT[triNdx], triW[triNdx], nxo, nyo),
												 projectedTriInterpolate(triR[triNdx], triW[triNdx], nxo, nyo));
					const tcu::Vec3	coordDxo	(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
												 triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo),
												 triDerivateX(triR[triNdx], triW[triNdx], wxo, dstW, nyo));
					const tcu::Vec3	coordDyo	(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
												 triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo),
												 triDerivateY(triR[triNdx], triW[triNdx], wyo, dstH, nxo));
					const tcu::Vec2	lodO		= tcu::computeCubeLodBoundsFromDerivates(coordO, coordDxo, coordDyo, srcSize, lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isTexCompareResultValid(src, sampleParams.sampler, comparePrec, coord, clampedLod, sampleParams.ref, resPix.x());

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}